

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeConcepts.hh
# Opt level: O2

bool __thiscall
avro::concepts::
NameIndexConcept<avro::concepts::NoAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::add(NameIndexConcept<avro::concepts::NoAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      *this,string *name,size_t index)

{
  Exception *this_00;
  allocator<char> local_39;
  string local_38;
  
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Name index does not exist",&local_39);
  Exception::Exception(this_00,&local_38);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

bool add(const::std::string &name, size_t index) {
        throw Exception("Name index does not exist");
        return false;
    }